

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  float fVar4;
  
  pIVar3 = GImGui;
  GImGui->Font = font;
  auVar2 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                      ZEXT416((uint)((pIVar3->IO).FontGlobalScale * font->FontSize * font->Scale)));
  pIVar3->FontBaseSize = auVar2._0_4_;
  if (pIVar3->CurrentWindow == (ImGuiWindow *)0x0) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = ImGuiWindow::CalcFontSize(pIVar3->CurrentWindow);
    font = pIVar3->Font;
  }
  pIVar3->FontSize = fVar4;
  pIVar1 = font->ContainerAtlas;
  (pIVar3->DrawListSharedData).TexUvWhitePixel = pIVar1->TexUvWhitePixel;
  (pIVar3->DrawListSharedData).TexUvLines = pIVar1->TexUvLines;
  (pIVar3->DrawListSharedData).Font = font;
  (pIVar3->DrawListSharedData).FontSize = fVar4;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}